

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool container_contains(container_t *c,uint16_t val,uint8_t typecode)

{
  uint8_t local_1b;
  uint16_t local_1a;
  uint8_t typecode_local;
  array_container_t *paStack_18;
  uint16_t val_local;
  container_t *c_local;
  
  local_1b = typecode;
  local_1a = val;
  paStack_18 = (array_container_t *)c;
  paStack_18 = (array_container_t *)container_unwrap_shared(c,&local_1b);
  if (local_1b == '\x01') {
    c_local._7_1_ = bitset_container_get((bitset_container_t *)paStack_18,local_1a);
  }
  else if (local_1b == '\x02') {
    c_local._7_1_ = array_container_contains(paStack_18,local_1a);
  }
  else {
    if (local_1b != '\x03') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x124d,"_Bool container_contains(const container_t *, uint16_t, uint8_t)");
    }
    c_local._7_1_ = run_container_contains((run_container_t *)paStack_18,local_1a);
  }
  return c_local._7_1_;
}

Assistant:

static inline bool container_contains(
    const container_t *c,
    uint16_t val,
    uint8_t typecode  // !!! should be second argument?
){
    c = container_unwrap_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_get(const_CAST_bitset(c), val);
        case ARRAY_CONTAINER_TYPE:
            return array_container_contains(const_CAST_array(c), val);
        case RUN_CONTAINER_TYPE:
            return run_container_contains(const_CAST_run(c), val);
        default:
            assert(false);
            __builtin_unreachable();
            return false;
    }
}